

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publisher.cpp
# Opt level: O1

void __thiscall
miniros::Publisher::Publisher
          (Publisher *this,string *topic,string *md5sum,string *datatype,NodeHandle *node_handle,
          SubscriberCallbacksPtr *callbacks)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  NodeHandle *pNVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_49;
  NodeHandle *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  (this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38 = &(this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<miniros::Publisher::Impl,std::allocator<miniros::Publisher::Impl>>
            (local_38,(Impl **)this,(allocator<miniros::Publisher::Impl> *)&local_48);
  std::__cxx11::string::_M_assign
            ((string *)
             (this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->impl_).
               super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              md5sum_);
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->impl_).
               super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              datatype_);
  local_48 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<miniros::NodeHandle,std::allocator<miniros::NodeHandle>,miniros::NodeHandle_const&>
            (&_Stack_40,&local_48,(allocator<miniros::NodeHandle> *)&local_49,node_handle);
  _Var3._M_pi = _Stack_40._M_pi;
  pNVar2 = local_48;
  peVar1 = (this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_48 = (NodeHandle *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (peVar1->node_handle_).
            super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (peVar1->node_handle_).super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = pNVar2;
  (peVar1->node_handle_).super___shared_ptr<miniros::NodeHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  peVar1 = (this->impl_).super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (peVar1->callbacks_).super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (callbacks->super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar1->callbacks_).
              super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(callbacks->
              super___shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  return;
}

Assistant:

Publisher::Publisher(const std::string& topic, const std::string& md5sum, const std::string& datatype, const NodeHandle& node_handle, const SubscriberCallbacksPtr& callbacks)
: impl_(std::make_shared<Impl>())
{
  impl_->topic_ = topic;
  impl_->md5sum_ = md5sum;
  impl_->datatype_ = datatype;
  impl_->node_handle_ = std::make_shared<NodeHandle>(node_handle);
  impl_->callbacks_ = callbacks;
}